

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMiMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [32];
  float fVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  ulong *puVar37;
  int iVar38;
  AABBNodeMB4D *node1;
  ulong uVar39;
  ulong uVar40;
  long lVar41;
  long lVar42;
  ulong uVar43;
  long lVar44;
  ulong unaff_RBX;
  size_t mask;
  Scene *pSVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  uint uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  bool bVar56;
  bool bVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar96;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [64];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar116;
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar117 [16];
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined1 local_1711;
  float local_1710;
  float fStack_170c;
  float fStack_1708;
  float fStack_1704;
  size_t local_1700;
  RayK<8> *local_16f8;
  undefined1 local_16f0 [16];
  undefined1 local_16e0 [16];
  undefined1 local_16d0 [16];
  undefined1 local_16c0 [16];
  ulong local_16b0;
  ulong local_16a8;
  ulong local_16a0;
  ulong local_1698;
  ulong local_1690;
  ulong local_1688;
  ulong *local_1680;
  Scene *local_1678;
  undefined1 local_1670 [16];
  undefined1 local_1660 [16];
  undefined1 local_1650 [16];
  undefined1 local_1640 [16];
  ulong local_1628;
  ulong local_1620;
  ulong *local_1618;
  RTCFilterFunctionNArguments local_1610;
  undefined1 local_15e0 [32];
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined1 local_15a0 [16];
  undefined1 local_1590 [16];
  undefined1 local_1580 [16];
  undefined1 local_1570 [16];
  undefined1 local_1560 [16];
  undefined8 local_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  float local_1530;
  float fStack_152c;
  float fStack_1528;
  float fStack_1524;
  undefined1 local_1520 [16];
  undefined1 local_1510 [16];
  undefined1 *local_1500;
  undefined1 local_14f0 [16];
  undefined1 local_14e0 [16];
  undefined1 local_14d0 [16];
  undefined1 local_14c0 [16];
  undefined1 local_14b0 [16];
  undefined1 local_14a0 [16];
  undefined1 local_1490 [16];
  undefined1 local_1480 [32];
  int local_1460;
  int iStack_145c;
  int iStack_1458;
  int iStack_1454;
  int iStack_1450;
  int iStack_144c;
  int iStack_1448;
  int iStack_1444;
  int local_1440;
  int iStack_143c;
  int iStack_1438;
  int iStack_1434;
  int iStack_1430;
  int iStack_142c;
  int iStack_1428;
  int iStack_1424;
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  float fStack_1404;
  float local_1400;
  float fStack_13fc;
  float fStack_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float fStack_13e8;
  float fStack_13e4;
  float local_13e0;
  float fStack_13dc;
  float fStack_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  float fStack_13c8;
  float fStack_13c4;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  undefined1 local_13a0 [8];
  float fStack_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  float local_1380;
  float fStack_137c;
  float fStack_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  float fStack_1368;
  float fStack_1364;
  undefined4 local_1360;
  undefined4 uStack_135c;
  undefined4 uStack_1358;
  undefined4 uStack_1354;
  undefined4 uStack_1350;
  undefined4 uStack_134c;
  undefined4 uStack_1348;
  undefined4 uStack_1344;
  undefined4 local_1340;
  undefined4 uStack_133c;
  undefined4 uStack_1338;
  undefined4 uStack_1334;
  undefined4 uStack_1330;
  undefined4 uStack_132c;
  undefined4 uStack_1328;
  undefined4 uStack_1324;
  RTCHitN local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined4 local_12c0;
  undefined4 uStack_12bc;
  undefined4 uStack_12b8;
  undefined4 uStack_12b4;
  undefined4 uStack_12b0;
  undefined4 uStack_12ac;
  undefined4 uStack_12a8;
  undefined4 uStack_12a4;
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  uint local_1240;
  uint uStack_123c;
  uint uStack_1238;
  uint uStack_1234;
  uint uStack_1230;
  uint uStack_122c;
  uint uStack_1228;
  uint uStack_1224;
  uint local_1220;
  uint uStack_121c;
  uint uStack_1218;
  uint uStack_1214;
  uint uStack_1210;
  uint uStack_120c;
  uint uStack_1208;
  uint uStack_1204;
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1200 = root.ptr;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_15e0._4_4_ = uVar2;
  local_15e0._0_4_ = uVar2;
  local_15e0._8_4_ = uVar2;
  local_15e0._12_4_ = uVar2;
  local_15e0._16_4_ = uVar2;
  local_15e0._20_4_ = uVar2;
  local_15e0._24_4_ = uVar2;
  local_15e0._28_4_ = uVar2;
  auVar109 = ZEXT3264(local_15e0);
  local_1340 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uStack_133c = local_1340;
  uStack_1338 = local_1340;
  uStack_1334 = local_1340;
  uStack_1330 = local_1340;
  uStack_132c = local_1340;
  uStack_1328 = local_1340;
  uStack_1324 = local_1340;
  local_1360 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uStack_135c = local_1360;
  uStack_1358 = local_1360;
  uStack_1354 = local_1360;
  uStack_1350 = local_1360;
  uStack_134c = local_1360;
  uStack_1348 = local_1360;
  uStack_1344 = local_1360;
  local_13e0 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1400 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1420 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_1380 = local_13e0 * 0.99999964;
  fStack_137c = local_1380;
  fStack_1378 = local_1380;
  fStack_1374 = local_1380;
  fStack_1370 = local_1380;
  fStack_136c = local_1380;
  fStack_1368 = local_1380;
  fStack_1364 = local_1380;
  fVar96 = local_1400 * 0.99999964;
  local_13a0._4_4_ = fVar96;
  local_13a0._0_4_ = fVar96;
  fStack_1398 = fVar96;
  fStack_1394 = fVar96;
  fStack_1390 = fVar96;
  fStack_138c = fVar96;
  fStack_1388 = fVar96;
  register0x0000131c = fVar96;
  local_13c0 = local_1420 * 0.99999964;
  fStack_13bc = local_13c0;
  fStack_13b8 = local_13c0;
  fStack_13b4 = local_13c0;
  fStack_13b0 = local_13c0;
  fStack_13ac = local_13c0;
  fStack_13a8 = local_13c0;
  fStack_13a4 = local_13c0;
  local_13e0 = local_13e0 * 1.0000004;
  fStack_13dc = local_13e0;
  fStack_13d8 = local_13e0;
  fStack_13d4 = local_13e0;
  fStack_13d0 = local_13e0;
  fStack_13cc = local_13e0;
  fStack_13c8 = local_13e0;
  fStack_13c4 = local_13e0;
  local_1400 = local_1400 * 1.0000004;
  fStack_13fc = local_1400;
  fStack_13f8 = local_1400;
  fStack_13f4 = local_1400;
  fStack_13f0 = local_1400;
  fStack_13ec = local_1400;
  fStack_13e8 = local_1400;
  fStack_13e4 = local_1400;
  local_1420 = local_1420 * 1.0000004;
  fStack_141c = local_1420;
  fStack_1418 = local_1420;
  fStack_1414 = local_1420;
  fStack_1410 = local_1420;
  fStack_140c = local_1420;
  fStack_1408 = local_1420;
  fStack_1404 = local_1420;
  uVar43 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar46 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar47 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar54 = uVar43 ^ 0x20;
  uVar49 = uVar46 ^ 0x20;
  uVar51 = uVar47 ^ 0x20;
  local_1440 = (tray->tnear).field_0.i[k];
  iStack_143c = local_1440;
  iStack_1438 = local_1440;
  iStack_1434 = local_1440;
  iStack_1430 = local_1440;
  iStack_142c = local_1440;
  iStack_1428 = local_1440;
  iStack_1424 = local_1440;
  local_1460 = (tray->tfar).field_0.i[k];
  iStack_145c = local_1460;
  iStack_1458 = local_1460;
  iStack_1454 = local_1460;
  iStack_1450 = local_1460;
  iStack_144c = local_1460;
  iStack_1448 = local_1460;
  iStack_1444 = local_1460;
  iVar38 = 1 << ((uint)k & 0x1f);
  auVar65._4_4_ = iVar38;
  auVar65._0_4_ = iVar38;
  auVar65._8_4_ = iVar38;
  auVar65._12_4_ = iVar38;
  auVar65._16_4_ = iVar38;
  auVar65._20_4_ = iVar38;
  auVar65._24_4_ = iVar38;
  auVar65._28_4_ = iVar38;
  auVar18 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar65 = vpand_avx2(auVar65,auVar18);
  local_1480 = vpcmpeqd_avx2(auVar65,auVar18);
  puVar37 = local_11f8;
  local_1700 = k;
  local_16f8 = ray;
  local_16b0 = uVar51;
  local_16a8 = uVar49;
  local_16a0 = uVar54;
  local_1698 = uVar47;
  local_1690 = uVar46;
  local_1688 = uVar43;
  do {
    local_1618 = puVar37;
    if (local_1618 == &local_1200) break;
    local_1680 = local_1618 + -1;
    uVar53 = local_1618[-1];
    do {
      if ((uVar53 & 8) == 0) {
        uVar39 = uVar53 & 0xfffffffffffffff0;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0xe0);
        auVar66._4_4_ = uVar2;
        auVar66._0_4_ = uVar2;
        auVar66._8_4_ = uVar2;
        auVar66._12_4_ = uVar2;
        auVar66._16_4_ = uVar2;
        auVar66._20_4_ = uVar2;
        auVar66._24_4_ = uVar2;
        auVar66._28_4_ = uVar2;
        auVar58 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar39 + 0x100 + uVar43),auVar66,
                                  *(undefined1 (*) [32])(uVar39 + 0x40 + uVar43));
        auVar65 = vsubps_avx(ZEXT1632(auVar58),auVar109._0_32_);
        auVar18._4_4_ = auVar65._4_4_ * fStack_137c;
        auVar18._0_4_ = auVar65._0_4_ * local_1380;
        auVar18._8_4_ = auVar65._8_4_ * fStack_1378;
        auVar18._12_4_ = auVar65._12_4_ * fStack_1374;
        auVar18._16_4_ = auVar65._16_4_ * fStack_1370;
        auVar18._20_4_ = auVar65._20_4_ * fStack_136c;
        auVar18._24_4_ = auVar65._24_4_ * fStack_1368;
        auVar18._28_4_ = auVar65._28_4_;
        auVar58 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar39 + 0x100 + uVar46),auVar66,
                                  *(undefined1 (*) [32])(uVar39 + 0x40 + uVar46));
        auVar34._4_4_ = iStack_143c;
        auVar34._0_4_ = local_1440;
        auVar34._8_4_ = iStack_1438;
        auVar34._12_4_ = iStack_1434;
        auVar34._16_4_ = iStack_1430;
        auVar34._20_4_ = iStack_142c;
        auVar34._24_4_ = iStack_1428;
        auVar34._28_4_ = iStack_1424;
        auVar65 = vmaxps_avx(auVar34,auVar18);
        auVar36._4_4_ = uStack_133c;
        auVar36._0_4_ = local_1340;
        auVar36._8_4_ = uStack_1338;
        auVar36._12_4_ = uStack_1334;
        auVar36._16_4_ = uStack_1330;
        auVar36._20_4_ = uStack_132c;
        auVar36._24_4_ = uStack_1328;
        auVar36._28_4_ = uStack_1324;
        auVar18 = vsubps_avx(ZEXT1632(auVar58),auVar36);
        auVar16._4_4_ = auVar18._4_4_ * (float)local_13a0._4_4_;
        auVar16._0_4_ = auVar18._0_4_ * (float)local_13a0._0_4_;
        auVar16._8_4_ = auVar18._8_4_ * fStack_1398;
        auVar16._12_4_ = auVar18._12_4_ * fStack_1394;
        auVar16._16_4_ = auVar18._16_4_ * fStack_1390;
        auVar16._20_4_ = auVar18._20_4_ * fStack_138c;
        auVar16._24_4_ = auVar18._24_4_ * fStack_1388;
        auVar16._28_4_ = auVar18._28_4_;
        auVar58 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar39 + 0x100 + uVar47),auVar66,
                                  *(undefined1 (*) [32])(uVar39 + 0x40 + uVar47));
        auVar35._4_4_ = uStack_135c;
        auVar35._0_4_ = local_1360;
        auVar35._8_4_ = uStack_1358;
        auVar35._12_4_ = uStack_1354;
        auVar35._16_4_ = uStack_1350;
        auVar35._20_4_ = uStack_134c;
        auVar35._24_4_ = uStack_1348;
        auVar35._28_4_ = uStack_1344;
        auVar18 = vsubps_avx(ZEXT1632(auVar58),auVar35);
        auVar19._4_4_ = auVar18._4_4_ * fStack_13bc;
        auVar19._0_4_ = auVar18._0_4_ * local_13c0;
        auVar19._8_4_ = auVar18._8_4_ * fStack_13b8;
        auVar19._12_4_ = auVar18._12_4_ * fStack_13b4;
        auVar19._16_4_ = auVar18._16_4_ * fStack_13b0;
        auVar19._20_4_ = auVar18._20_4_ * fStack_13ac;
        auVar19._24_4_ = auVar18._24_4_ * fStack_13a8;
        auVar19._28_4_ = auVar18._28_4_;
        auVar18 = vmaxps_avx(auVar16,auVar19);
        auVar58 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar39 + 0x100 + uVar54),auVar66,
                                  *(undefined1 (*) [32])(uVar39 + 0x40 + uVar54));
        auVar65 = vmaxps_avx(auVar65,auVar18);
        auVar18 = vsubps_avx(ZEXT1632(auVar58),auVar109._0_32_);
        auVar20._4_4_ = auVar18._4_4_ * fStack_13dc;
        auVar20._0_4_ = auVar18._0_4_ * local_13e0;
        auVar20._8_4_ = auVar18._8_4_ * fStack_13d8;
        auVar20._12_4_ = auVar18._12_4_ * fStack_13d4;
        auVar20._16_4_ = auVar18._16_4_ * fStack_13d0;
        auVar20._20_4_ = auVar18._20_4_ * fStack_13cc;
        auVar20._24_4_ = auVar18._24_4_ * fStack_13c8;
        auVar20._28_4_ = auVar18._28_4_;
        auVar33._4_4_ = iStack_145c;
        auVar33._0_4_ = local_1460;
        auVar33._8_4_ = iStack_1458;
        auVar33._12_4_ = iStack_1454;
        auVar33._16_4_ = iStack_1450;
        auVar33._20_4_ = iStack_144c;
        auVar33._24_4_ = iStack_1448;
        auVar33._28_4_ = iStack_1444;
        auVar18 = vminps_avx(auVar33,auVar20);
        auVar58 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar39 + 0x100 + uVar49),auVar66,
                                  *(undefined1 (*) [32])(uVar39 + 0x40 + uVar49));
        auVar16 = vsubps_avx(ZEXT1632(auVar58),auVar36);
        auVar21._4_4_ = auVar16._4_4_ * fStack_13fc;
        auVar21._0_4_ = auVar16._0_4_ * local_1400;
        auVar21._8_4_ = auVar16._8_4_ * fStack_13f8;
        auVar21._12_4_ = auVar16._12_4_ * fStack_13f4;
        auVar21._16_4_ = auVar16._16_4_ * fStack_13f0;
        auVar21._20_4_ = auVar16._20_4_ * fStack_13ec;
        auVar21._24_4_ = auVar16._24_4_ * fStack_13e8;
        auVar21._28_4_ = auVar16._28_4_;
        auVar58 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar39 + 0x100 + uVar51),auVar66,
                                  *(undefined1 (*) [32])(uVar39 + 0x40 + uVar51));
        auVar16 = vsubps_avx(ZEXT1632(auVar58),auVar35);
        auVar22._4_4_ = auVar16._4_4_ * fStack_141c;
        auVar22._0_4_ = auVar16._0_4_ * local_1420;
        auVar22._8_4_ = auVar16._8_4_ * fStack_1418;
        auVar22._12_4_ = auVar16._12_4_ * fStack_1414;
        auVar22._16_4_ = auVar16._16_4_ * fStack_1410;
        auVar22._20_4_ = auVar16._20_4_ * fStack_140c;
        auVar22._24_4_ = auVar16._24_4_ * fStack_1408;
        auVar22._28_4_ = auVar16._28_4_;
        auVar16 = vminps_avx(auVar21,auVar22);
        auVar18 = vminps_avx(auVar18,auVar16);
        auVar65 = vcmpps_avx(auVar65,auVar18,2);
        if (((uint)uVar53 & 7) == 6) {
          auVar18 = vcmpps_avx(*(undefined1 (*) [32])(uVar39 + 0x1c0),auVar66,2);
          auVar16 = vcmpps_avx(auVar66,*(undefined1 (*) [32])(uVar39 + 0x1e0),1);
          auVar18 = vandps_avx(auVar18,auVar16);
          auVar65 = vandps_avx(auVar18,auVar65);
          auVar58 = vpackssdw_avx(auVar65._0_16_,auVar65._16_16_);
        }
        else {
          auVar58 = vpackssdw_avx(auVar65._0_16_,auVar65._16_16_);
        }
        auVar58 = vpsllw_avx(auVar58,0xf);
        auVar58 = vpacksswb_avx(auVar58,auVar58);
        unaff_RBX = (ulong)(byte)(SUB161(auVar58 >> 7,0) & 1 | (SUB161(auVar58 >> 0xf,0) & 1) << 1 |
                                  (SUB161(auVar58 >> 0x17,0) & 1) << 2 |
                                  (SUB161(auVar58 >> 0x1f,0) & 1) << 3 |
                                  (SUB161(auVar58 >> 0x27,0) & 1) << 4 |
                                  (SUB161(auVar58 >> 0x2f,0) & 1) << 5 |
                                  (SUB161(auVar58 >> 0x37,0) & 1) << 6 |
                                 SUB161(auVar58 >> 0x3f,0) << 7);
      }
      if ((uVar53 & 8) == 0) {
        if (unaff_RBX == 0) {
          uVar50 = 4;
        }
        else {
          uVar39 = uVar53 & 0xfffffffffffffff0;
          lVar41 = 0;
          for (uVar53 = unaff_RBX; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
            lVar41 = lVar41 + 1;
          }
          for (uVar40 = unaff_RBX - 1 & unaff_RBX; uVar53 = *(ulong *)(uVar39 + lVar41 * 8),
              uVar40 != 0; uVar40 = uVar40 - 1 & uVar40) {
            *local_1680 = uVar53;
            local_1680 = local_1680 + 1;
            lVar41 = 0;
            for (uVar53 = uVar40; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
              lVar41 = lVar41 + 1;
            }
          }
          uVar50 = 0;
        }
      }
      else {
        uVar50 = 6;
      }
    } while (uVar50 == 0);
    if (uVar50 == 6) {
      uVar50 = 0;
      local_1628 = (ulong)((uint)uVar53 & 0xf) - 8;
      bVar56 = local_1628 != 0;
      if (bVar56) {
        uVar53 = uVar53 & 0xfffffffffffffff0;
        local_1620 = 0;
        do {
          lVar44 = local_1620 * 0x50;
          pSVar45 = context->scene;
          pGVar4 = (pSVar45->geometries).items[*(uint *)(uVar53 + 0x30 + lVar44)].ptr;
          fVar96 = (pGVar4->time_range).lower;
          fVar96 = pGVar4->fnumTimeSegments *
                   ((*(float *)(ray + k * 4 + 0xe0) - fVar96) /
                   ((pGVar4->time_range).upper - fVar96));
          auVar58 = vroundss_avx(ZEXT416((uint)fVar96),ZEXT416((uint)fVar96),9);
          auVar58 = vminss_avx(auVar58,ZEXT416((uint)(pGVar4->fnumTimeSegments + -1.0)));
          auVar71 = vmaxss_avx(ZEXT816(0),auVar58);
          lVar42 = (long)(int)auVar71._0_4_ * 0x38;
          uVar55 = (ulong)*(uint *)(uVar53 + 4 + lVar44);
          lVar41 = *(long *)(*(long *)&pGVar4[2].numPrimitives + lVar42);
          lVar42 = *(long *)(*(long *)&pGVar4[2].numPrimitives + 0x38 + lVar42);
          auVar58 = *(undefined1 (*) [16])(lVar41 + (ulong)*(uint *)(uVar53 + lVar44) * 4);
          uVar43 = (ulong)*(uint *)(uVar53 + 0x10 + lVar44);
          auVar99 = *(undefined1 (*) [16])(lVar41 + uVar43 * 4);
          uVar46 = (ulong)*(uint *)(uVar53 + 0x20 + lVar44);
          auVar79 = *(undefined1 (*) [16])(lVar41 + uVar46 * 4);
          auVar68 = *(undefined1 (*) [16])(lVar41 + uVar55 * 4);
          uVar47 = (ulong)*(uint *)(uVar53 + 0x14 + lVar44);
          auVar87 = *(undefined1 (*) [16])(lVar41 + uVar47 * 4);
          uVar49 = (ulong)*(uint *)(uVar53 + 0x24 + lVar44);
          auVar80 = *(undefined1 (*) [16])(lVar41 + uVar49 * 4);
          uVar51 = (ulong)*(uint *)(uVar53 + 8 + lVar44);
          auVar97 = *(undefined1 (*) [16])(lVar41 + uVar51 * 4);
          uVar40 = (ulong)*(uint *)(uVar53 + 0x18 + lVar44);
          auVar92 = *(undefined1 (*) [16])(lVar41 + uVar40 * 4);
          uVar54 = (ulong)*(uint *)(uVar53 + 0x28 + lVar44);
          auVar67 = *(undefined1 (*) [16])(lVar41 + uVar54 * 4);
          uVar52 = (ulong)*(uint *)(uVar53 + 0xc + lVar44);
          auVar62 = *(undefined1 (*) [16])(lVar41 + uVar52 * 4);
          uVar48 = (ulong)*(uint *)(uVar53 + 0x1c + lVar44);
          auVar60 = *(undefined1 (*) [16])(lVar41 + uVar48 * 4);
          uVar39 = (ulong)*(uint *)(uVar53 + 0x2c + lVar44);
          auVar59 = *(undefined1 (*) [16])(lVar41 + uVar39 * 4);
          auVar61 = *(undefined1 (*) [16])(lVar42 + (ulong)*(uint *)(uVar53 + lVar44) * 4);
          auVar72 = *(undefined1 (*) [16])(lVar42 + uVar43 * 4);
          fVar96 = fVar96 - auVar71._0_4_;
          auVar71 = vunpcklps_avx(auVar58,auVar97);
          auVar97 = vunpckhps_avx(auVar58,auVar97);
          auVar75 = vunpcklps_avx(auVar68,auVar62);
          auVar68 = vunpckhps_avx(auVar68,auVar62);
          auVar58 = *(undefined1 (*) [16])(lVar42 + uVar55 * 4);
          auVar76 = vunpcklps_avx(auVar97,auVar68);
          auVar77 = vunpcklps_avx(auVar71,auVar75);
          auVar97 = vunpckhps_avx(auVar71,auVar75);
          auVar62 = vunpcklps_avx(auVar99,auVar92);
          auVar68 = vunpckhps_avx(auVar99,auVar92);
          auVar92 = vunpcklps_avx(auVar87,auVar60);
          auVar87 = vunpckhps_avx(auVar87,auVar60);
          auVar99 = *(undefined1 (*) [16])(lVar42 + uVar51 * 4);
          auVar60 = vunpcklps_avx(auVar68,auVar87);
          auVar71 = vunpcklps_avx(auVar62,auVar92);
          auVar87 = vunpckhps_avx(auVar62,auVar92);
          auVar62 = vunpcklps_avx(auVar79,auVar67);
          auVar92 = vunpckhps_avx(auVar79,auVar67);
          auVar75 = vunpcklps_avx(auVar80,auVar59);
          auVar67 = vunpckhps_avx(auVar80,auVar59);
          auVar68 = *(undefined1 (*) [16])(lVar42 + uVar52 * 4);
          auVar59 = vunpcklps_avx(auVar92,auVar67);
          auVar79 = vunpcklps_avx(auVar62,auVar75);
          auVar92 = vunpckhps_avx(auVar62,auVar75);
          auVar67 = vunpcklps_avx(auVar61,auVar99);
          auVar99 = vunpckhps_avx(auVar61,auVar99);
          auVar62 = vunpcklps_avx(auVar58,auVar68);
          auVar68 = vunpckhps_avx(auVar58,auVar68);
          auVar58 = *(undefined1 (*) [16])(lVar42 + uVar40 * 4);
          auVar61 = vunpcklps_avx(auVar99,auVar68);
          auVar75 = vunpcklps_avx(auVar67,auVar62);
          auVar68 = vunpckhps_avx(auVar67,auVar62);
          auVar62 = vunpcklps_avx(auVar72,auVar58);
          auVar67 = vunpckhps_avx(auVar72,auVar58);
          auVar58 = *(undefined1 (*) [16])(lVar42 + uVar47 * 4);
          auVar99 = *(undefined1 (*) [16])(lVar42 + uVar48 * 4);
          auVar72 = vunpcklps_avx(auVar58,auVar99);
          auVar58 = vunpckhps_avx(auVar58,auVar99);
          auVar80 = vunpcklps_avx(auVar67,auVar58);
          auVar78 = vunpcklps_avx(auVar62,auVar72);
          auVar67 = vunpckhps_avx(auVar62,auVar72);
          auVar58 = *(undefined1 (*) [16])(lVar42 + uVar46 * 4);
          auVar99 = *(undefined1 (*) [16])(lVar42 + uVar54 * 4);
          auVar72 = vunpcklps_avx(auVar58,auVar99);
          auVar62 = vunpckhps_avx(auVar58,auVar99);
          auVar58 = *(undefined1 (*) [16])(lVar42 + uVar49 * 4);
          auVar99 = *(undefined1 (*) [16])(lVar42 + uVar39 * 4);
          auVar81 = vunpcklps_avx(auVar58,auVar99);
          auVar58 = vunpckhps_avx(auVar58,auVar99);
          auVar99 = vunpcklps_avx(auVar62,auVar58);
          auVar62 = vunpcklps_avx(auVar72,auVar81);
          auVar58 = vunpckhps_avx(auVar72,auVar81);
          fVar17 = 1.0 - fVar96;
          auVar112._4_4_ = fVar17;
          auVar112._0_4_ = fVar17;
          auVar112._8_4_ = fVar17;
          auVar112._12_4_ = fVar17;
          auVar89._0_4_ = fVar96 * auVar75._0_4_;
          auVar89._4_4_ = fVar96 * auVar75._4_4_;
          auVar89._8_4_ = fVar96 * auVar75._8_4_;
          auVar89._12_4_ = fVar96 * auVar75._12_4_;
          auVar72 = vfmadd231ps_fma(auVar89,auVar112,auVar77);
          auVar105._0_4_ = fVar96 * auVar68._0_4_;
          auVar105._4_4_ = fVar96 * auVar68._4_4_;
          auVar105._8_4_ = fVar96 * auVar68._8_4_;
          auVar105._12_4_ = fVar96 * auVar68._12_4_;
          auVar68 = vfmadd231ps_fma(auVar105,auVar112,auVar97);
          auVar97._0_4_ = fVar96 * auVar61._0_4_;
          auVar97._4_4_ = fVar96 * auVar61._4_4_;
          auVar97._8_4_ = fVar96 * auVar61._8_4_;
          auVar97._12_4_ = fVar96 * auVar61._12_4_;
          auVar97 = vfmadd231ps_fma(auVar97,auVar112,auVar76);
          auVar85._0_4_ = fVar96 * auVar78._0_4_;
          auVar85._4_4_ = fVar96 * auVar78._4_4_;
          auVar85._8_4_ = fVar96 * auVar78._8_4_;
          auVar85._12_4_ = fVar96 * auVar78._12_4_;
          auVar61 = vfmadd231ps_fma(auVar85,auVar112,auVar71);
          auVar78._0_4_ = fVar96 * auVar67._0_4_;
          auVar78._4_4_ = fVar96 * auVar67._4_4_;
          auVar78._8_4_ = fVar96 * auVar67._8_4_;
          auVar78._12_4_ = fVar96 * auVar67._12_4_;
          auVar87 = vfmadd231ps_fma(auVar78,auVar112,auVar87);
          puVar1 = (undefined8 *)(uVar53 + 0x30 + lVar44);
          local_1540 = *puVar1;
          uStack_1538 = puVar1[1];
          puVar1 = (undefined8 *)(uVar53 + 0x40 + lVar44);
          auVar67._0_4_ = fVar96 * auVar80._0_4_;
          auVar67._4_4_ = fVar96 * auVar80._4_4_;
          auVar67._8_4_ = fVar96 * auVar80._8_4_;
          auVar67._12_4_ = fVar96 * auVar80._12_4_;
          auVar67 = vfmadd231ps_fma(auVar67,auVar112,auVar60);
          auVar71._0_4_ = fVar96 * auVar62._0_4_;
          auVar71._4_4_ = fVar96 * auVar62._4_4_;
          auVar71._8_4_ = fVar96 * auVar62._8_4_;
          auVar71._12_4_ = fVar96 * auVar62._12_4_;
          auVar75._0_4_ = fVar96 * auVar58._0_4_;
          auVar75._4_4_ = fVar96 * auVar58._4_4_;
          auVar75._8_4_ = fVar96 * auVar58._8_4_;
          auVar75._12_4_ = fVar96 * auVar58._12_4_;
          auVar110._0_4_ = fVar96 * auVar99._0_4_;
          auVar110._4_4_ = fVar96 * auVar99._4_4_;
          auVar110._8_4_ = fVar96 * auVar99._8_4_;
          auVar110._12_4_ = fVar96 * auVar99._12_4_;
          auVar62 = vfmadd231ps_fma(auVar71,auVar112,auVar79);
          auVar92 = vfmadd231ps_fma(auVar75,auVar112,auVar92);
          auVar60 = vfmadd231ps_fma(auVar110,auVar112,auVar59);
          local_1550 = *puVar1;
          uStack_1548 = puVar1[1];
          local_1500 = &local_1711;
          uVar2 = *(undefined4 *)(local_16f8 + local_1700 * 4);
          auVar59._4_4_ = uVar2;
          auVar59._0_4_ = uVar2;
          auVar59._8_4_ = uVar2;
          auVar59._12_4_ = uVar2;
          uVar2 = *(undefined4 *)(local_16f8 + local_1700 * 4 + 0x20);
          auVar113._4_4_ = uVar2;
          auVar113._0_4_ = uVar2;
          auVar113._8_4_ = uVar2;
          auVar113._12_4_ = uVar2;
          uVar2 = *(undefined4 *)(local_16f8 + local_1700 * 4 + 0x40);
          auVar115._4_4_ = uVar2;
          auVar115._0_4_ = uVar2;
          auVar115._8_4_ = uVar2;
          auVar115._12_4_ = uVar2;
          local_1640 = vsubps_avx(auVar72,auVar59);
          local_16e0 = vsubps_avx(auVar68,auVar113);
          local_16f0 = vsubps_avx(auVar97,auVar115);
          auVar58 = vsubps_avx(auVar61,auVar59);
          auVar99 = vsubps_avx(auVar87,auVar113);
          auVar68 = vsubps_avx(auVar67,auVar115);
          auVar87 = vsubps_avx(auVar62,auVar59);
          auVar97 = vsubps_avx(auVar92,auVar113);
          auVar92 = vsubps_avx(auVar60,auVar115);
          local_1650 = vsubps_avx(auVar87,local_1640);
          local_1670 = vsubps_avx(auVar97,local_16e0);
          local_1660 = vsubps_avx(auVar92,local_16f0);
          auVar60._0_4_ = auVar87._0_4_ + local_1640._0_4_;
          auVar60._4_4_ = auVar87._4_4_ + local_1640._4_4_;
          auVar60._8_4_ = auVar87._8_4_ + local_1640._8_4_;
          auVar60._12_4_ = auVar87._12_4_ + local_1640._12_4_;
          auVar76._0_4_ = auVar97._0_4_ + local_16e0._0_4_;
          auVar76._4_4_ = auVar97._4_4_ + local_16e0._4_4_;
          auVar76._8_4_ = auVar97._8_4_ + local_16e0._8_4_;
          auVar76._12_4_ = auVar97._12_4_ + local_16e0._12_4_;
          fVar96 = local_16f0._0_4_;
          auVar79._0_4_ = auVar92._0_4_ + fVar96;
          fVar17 = local_16f0._4_4_;
          auVar79._4_4_ = auVar92._4_4_ + fVar17;
          fVar6 = local_16f0._8_4_;
          auVar79._8_4_ = auVar92._8_4_ + fVar6;
          fVar7 = local_16f0._12_4_;
          auVar79._12_4_ = auVar92._12_4_ + fVar7;
          auVar114._0_4_ = local_1660._0_4_ * auVar76._0_4_;
          auVar114._4_4_ = local_1660._4_4_ * auVar76._4_4_;
          auVar114._8_4_ = local_1660._8_4_ * auVar76._8_4_;
          auVar114._12_4_ = local_1660._12_4_ * auVar76._12_4_;
          auVar62 = vfmsub231ps_fma(auVar114,local_1670,auVar79);
          auVar80._0_4_ = local_1650._0_4_ * auVar79._0_4_;
          auVar80._4_4_ = local_1650._4_4_ * auVar79._4_4_;
          auVar80._8_4_ = local_1650._8_4_ * auVar79._8_4_;
          auVar80._12_4_ = local_1650._12_4_ * auVar79._12_4_;
          auVar67 = vfmsub231ps_fma(auVar80,local_1660,auVar60);
          auVar61._0_4_ = local_1670._0_4_ * auVar60._0_4_;
          auVar61._4_4_ = local_1670._4_4_ * auVar60._4_4_;
          auVar61._8_4_ = local_1670._8_4_ * auVar60._8_4_;
          auVar61._12_4_ = local_1670._12_4_ * auVar60._12_4_;
          auVar60 = vfmsub231ps_fma(auVar61,local_1650,auVar76);
          fStack_170c = *(float *)(local_16f8 + local_1700 * 4 + 0xc0);
          auVar72._0_4_ = fStack_170c * auVar60._0_4_;
          auVar72._4_4_ = fStack_170c * auVar60._4_4_;
          auVar72._8_4_ = fStack_170c * auVar60._8_4_;
          auVar72._12_4_ = fStack_170c * auVar60._12_4_;
          uVar2 = *(undefined4 *)(local_16f8 + local_1700 * 4 + 0xa0);
          auVar106._4_4_ = uVar2;
          auVar106._0_4_ = uVar2;
          auVar106._8_4_ = uVar2;
          auVar106._12_4_ = uVar2;
          auVar67 = vfmadd231ps_fma(auVar72,auVar106,auVar67);
          uVar2 = *(undefined4 *)(local_16f8 + local_1700 * 4 + 0x80);
          local_16c0._4_4_ = uVar2;
          local_16c0._0_4_ = uVar2;
          local_16c0._8_4_ = uVar2;
          local_16c0._12_4_ = uVar2;
          local_1590 = vfmadd231ps_fma(auVar67,local_16c0,auVar62);
          local_1560 = vsubps_avx(local_16e0,auVar99);
          local_1580 = vsubps_avx(local_16f0,auVar68);
          auVar77._0_4_ = local_16e0._0_4_ + auVar99._0_4_;
          auVar77._4_4_ = local_16e0._4_4_ + auVar99._4_4_;
          auVar77._8_4_ = local_16e0._8_4_ + auVar99._8_4_;
          auVar77._12_4_ = local_16e0._12_4_ + auVar99._12_4_;
          auVar81._0_4_ = auVar68._0_4_ + fVar96;
          auVar81._4_4_ = auVar68._4_4_ + fVar17;
          auVar81._8_4_ = auVar68._8_4_ + fVar6;
          auVar81._12_4_ = auVar68._12_4_ + fVar7;
          fVar8 = local_1580._0_4_;
          auVar90._0_4_ = auVar77._0_4_ * fVar8;
          fVar10 = local_1580._4_4_;
          auVar90._4_4_ = auVar77._4_4_ * fVar10;
          fVar12 = local_1580._8_4_;
          auVar90._8_4_ = auVar77._8_4_ * fVar12;
          fVar14 = local_1580._12_4_;
          auVar90._12_4_ = auVar77._12_4_ * fVar14;
          auVar62 = vfmsub231ps_fma(auVar90,local_1560,auVar81);
          local_1570 = vsubps_avx(local_1640,auVar58);
          fVar116 = local_1570._0_4_;
          auVar98._0_4_ = fVar116 * auVar81._0_4_;
          fVar118 = local_1570._4_4_;
          auVar98._4_4_ = fVar118 * auVar81._4_4_;
          fVar119 = local_1570._8_4_;
          auVar98._8_4_ = fVar119 * auVar81._8_4_;
          fVar120 = local_1570._12_4_;
          auVar98._12_4_ = fVar120 * auVar81._12_4_;
          auVar82._0_4_ = local_1640._0_4_ + auVar58._0_4_;
          auVar82._4_4_ = local_1640._4_4_ + auVar58._4_4_;
          auVar82._8_4_ = local_1640._8_4_ + auVar58._8_4_;
          auVar82._12_4_ = local_1640._12_4_ + auVar58._12_4_;
          auVar67 = vfmsub231ps_fma(auVar98,local_1580,auVar82);
          fVar9 = local_1560._0_4_;
          auVar83._0_4_ = auVar82._0_4_ * fVar9;
          fVar11 = local_1560._4_4_;
          auVar83._4_4_ = auVar82._4_4_ * fVar11;
          fVar13 = local_1560._8_4_;
          auVar83._8_4_ = auVar82._8_4_ * fVar13;
          fVar15 = local_1560._12_4_;
          auVar83._12_4_ = auVar82._12_4_ * fVar15;
          auVar60 = vfmsub231ps_fma(auVar83,local_1570,auVar77);
          auVar84._0_4_ = fStack_170c * auVar60._0_4_;
          auVar84._4_4_ = fStack_170c * auVar60._4_4_;
          auVar84._8_4_ = fStack_170c * auVar60._8_4_;
          auVar84._12_4_ = fStack_170c * auVar60._12_4_;
          auVar67 = vfmadd231ps_fma(auVar84,auVar106,auVar67);
          local_1520 = vfmadd231ps_fma(auVar67,local_16c0,auVar62);
          auVar67 = vsubps_avx(auVar58,auVar87);
          auVar91._0_4_ = auVar87._0_4_ + auVar58._0_4_;
          auVar91._4_4_ = auVar87._4_4_ + auVar58._4_4_;
          auVar91._8_4_ = auVar87._8_4_ + auVar58._8_4_;
          auVar91._12_4_ = auVar87._12_4_ + auVar58._12_4_;
          auVar87 = vsubps_avx(auVar99,auVar97);
          auVar62._0_4_ = auVar99._0_4_ + auVar97._0_4_;
          auVar62._4_4_ = auVar99._4_4_ + auVar97._4_4_;
          auVar62._8_4_ = auVar99._8_4_ + auVar97._8_4_;
          auVar62._12_4_ = auVar99._12_4_ + auVar97._12_4_;
          auVar97 = vsubps_avx(auVar68,auVar92);
          auVar58._0_4_ = auVar68._0_4_ + auVar92._0_4_;
          auVar58._4_4_ = auVar68._4_4_ + auVar92._4_4_;
          auVar58._8_4_ = auVar68._8_4_ + auVar92._8_4_;
          auVar58._12_4_ = auVar68._12_4_ + auVar92._12_4_;
          auVar99._0_4_ = auVar62._0_4_ * auVar97._0_4_;
          auVar99._4_4_ = auVar62._4_4_ * auVar97._4_4_;
          auVar99._8_4_ = auVar62._8_4_ * auVar97._8_4_;
          auVar99._12_4_ = auVar62._12_4_ * auVar97._12_4_;
          auVar99 = vfmsub231ps_fma(auVar99,auVar87,auVar58);
          auVar68._0_4_ = auVar58._0_4_ * auVar67._0_4_;
          auVar68._4_4_ = auVar58._4_4_ * auVar67._4_4_;
          auVar68._8_4_ = auVar58._8_4_ * auVar67._8_4_;
          auVar68._12_4_ = auVar58._12_4_ * auVar67._12_4_;
          auVar58 = vfmsub231ps_fma(auVar68,auVar97,auVar91);
          auVar92._0_4_ = auVar87._0_4_ * auVar91._0_4_;
          auVar92._4_4_ = auVar87._4_4_ * auVar91._4_4_;
          auVar92._8_4_ = auVar87._8_4_ * auVar91._8_4_;
          auVar92._12_4_ = auVar87._12_4_ * auVar91._12_4_;
          auVar68 = vfmsub231ps_fma(auVar92,auVar67,auVar62);
          local_1710 = fStack_170c;
          fStack_1708 = fStack_170c;
          fStack_1704 = fStack_170c;
          auVar93._0_4_ = fStack_170c * auVar68._0_4_;
          auVar93._4_4_ = fStack_170c * auVar68._4_4_;
          auVar93._8_4_ = fStack_170c * auVar68._8_4_;
          auVar93._12_4_ = fStack_170c * auVar68._12_4_;
          auVar58 = vfmadd231ps_fma(auVar93,auVar106,auVar58);
          auVar68 = vfmadd231ps_fma(auVar58,local_16c0,auVar99);
          local_1530 = local_1590._0_4_;
          fStack_152c = local_1590._4_4_;
          fStack_1528 = local_1590._8_4_;
          fStack_1524 = local_1590._12_4_;
          local_1510._0_4_ = auVar68._0_4_ + local_1530 + local_1520._0_4_;
          local_1510._4_4_ = auVar68._4_4_ + fStack_152c + local_1520._4_4_;
          local_1510._8_4_ = auVar68._8_4_ + fStack_1528 + local_1520._8_4_;
          local_1510._12_4_ = auVar68._12_4_ + fStack_1524 + local_1520._12_4_;
          auVar117._8_4_ = 0x7fffffff;
          auVar117._0_8_ = 0x7fffffff7fffffff;
          auVar117._12_4_ = 0x7fffffff;
          auVar58 = vminps_avx(local_1590,local_1520);
          auVar58 = vminps_avx(auVar58,auVar68);
          local_15a0 = vandps_avx(local_1510,auVar117);
          auVar107._0_4_ = local_15a0._0_4_ * 1.1920929e-07;
          auVar107._4_4_ = local_15a0._4_4_ * 1.1920929e-07;
          auVar107._8_4_ = local_15a0._8_4_ * 1.1920929e-07;
          auVar107._12_4_ = local_15a0._12_4_ * 1.1920929e-07;
          uVar43 = CONCAT44(auVar107._4_4_,auVar107._0_4_);
          auVar100._0_8_ = uVar43 ^ 0x8000000080000000;
          auVar100._8_4_ = -auVar107._8_4_;
          auVar100._12_4_ = -auVar107._12_4_;
          auVar58 = vcmpps_avx(auVar58,auVar100,5);
          auVar99 = vmaxps_avx(local_1590,local_1520);
          auVar99 = vmaxps_avx(auVar99,auVar68);
          auVar99 = vcmpps_avx(auVar99,auVar107,2);
          auVar109 = ZEXT3264(local_15e0);
          local_16d0 = vorps_avx(auVar58,auVar99);
          k = local_1700;
          ray = local_16f8;
          if ((((local_16d0 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (local_16d0 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (local_16d0 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              local_16d0[0xf] < '\0') {
            auVar69._0_4_ = fVar9 * local_1660._0_4_;
            auVar69._4_4_ = fVar11 * local_1660._4_4_;
            auVar69._8_4_ = fVar13 * local_1660._8_4_;
            auVar69._12_4_ = fVar15 * local_1660._12_4_;
            auVar94._0_4_ = fVar116 * local_1670._0_4_;
            auVar94._4_4_ = fVar118 * local_1670._4_4_;
            auVar94._8_4_ = fVar119 * local_1670._8_4_;
            auVar94._12_4_ = fVar120 * local_1670._12_4_;
            auVar68 = vfmsub213ps_fma(local_1670,local_1580,auVar69);
            auVar101._0_4_ = auVar87._0_4_ * fVar8;
            auVar101._4_4_ = auVar87._4_4_ * fVar10;
            auVar101._8_4_ = auVar87._8_4_ * fVar12;
            auVar101._12_4_ = auVar87._12_4_ * fVar14;
            auVar108._0_4_ = fVar116 * auVar97._0_4_;
            auVar108._4_4_ = fVar118 * auVar97._4_4_;
            auVar108._8_4_ = fVar119 * auVar97._8_4_;
            auVar108._12_4_ = fVar120 * auVar97._12_4_;
            auVar97 = vfmsub213ps_fma(auVar97,local_1560,auVar101);
            auVar58 = vandps_avx(auVar117,auVar69);
            auVar99 = vandps_avx(auVar117,auVar101);
            auVar58 = vcmpps_avx(auVar58,auVar99,1);
            local_14b0 = vblendvps_avx(auVar97,auVar68,auVar58);
            auVar86._0_4_ = fVar9 * auVar67._0_4_;
            auVar86._4_4_ = fVar11 * auVar67._4_4_;
            auVar86._8_4_ = fVar13 * auVar67._8_4_;
            auVar86._12_4_ = fVar15 * auVar67._12_4_;
            auVar68 = vfmsub213ps_fma(auVar67,local_1580,auVar108);
            auVar102._0_4_ = local_1650._0_4_ * fVar8;
            auVar102._4_4_ = local_1650._4_4_ * fVar10;
            auVar102._8_4_ = local_1650._8_4_ * fVar12;
            auVar102._12_4_ = local_1650._12_4_ * fVar14;
            auVar97 = vfmsub213ps_fma(local_1660,local_1570,auVar102);
            auVar58 = vandps_avx(auVar117,auVar102);
            auVar99 = vandps_avx(auVar108,auVar117);
            auVar58 = vcmpps_avx(auVar58,auVar99,1);
            auVar109 = ZEXT3264(local_15e0);
            local_14a0 = vblendvps_avx(auVar68,auVar97,auVar58);
            auVar68 = vfmsub213ps_fma(local_1650,local_1560,auVar94);
            auVar87 = vfmsub213ps_fma(auVar87,local_1570,auVar86);
            auVar58 = vandps_avx(auVar117,auVar94);
            auVar99 = vandps_avx(auVar117,auVar86);
            auVar58 = vcmpps_avx(auVar58,auVar99,1);
            local_1490 = vblendvps_avx(auVar87,auVar68,auVar58);
            auVar87._0_4_ = local_1490._0_4_ * fStack_170c;
            auVar87._4_4_ = local_1490._4_4_ * fStack_170c;
            auVar87._8_4_ = local_1490._8_4_ * fStack_170c;
            auVar87._12_4_ = local_1490._12_4_ * fStack_170c;
            auVar58 = vfmadd213ps_fma(auVar106,local_14a0,auVar87);
            auVar58 = vfmadd213ps_fma(local_16c0,local_14b0,auVar58);
            auVar88._0_4_ = auVar58._0_4_ + auVar58._0_4_;
            auVar88._4_4_ = auVar58._4_4_ + auVar58._4_4_;
            auVar88._8_4_ = auVar58._8_4_ + auVar58._8_4_;
            auVar88._12_4_ = auVar58._12_4_ + auVar58._12_4_;
            auVar95._0_4_ = local_1490._0_4_ * fVar96;
            auVar95._4_4_ = local_1490._4_4_ * fVar17;
            auVar95._8_4_ = local_1490._8_4_ * fVar6;
            auVar95._12_4_ = local_1490._12_4_ * fVar7;
            auVar58 = vfmadd213ps_fma(local_16e0,local_14a0,auVar95);
            auVar99 = vfmadd213ps_fma(local_1640,local_14b0,auVar58);
            auVar58 = vrcpps_avx(auVar88);
            auVar111._8_4_ = 0x3f800000;
            auVar111._0_8_ = &DAT_3f8000003f800000;
            auVar111._12_4_ = 0x3f800000;
            auVar68 = vfnmadd213ps_fma(auVar58,auVar88,auVar111);
            auVar58 = vfmadd132ps_fma(auVar68,auVar58,auVar58);
            local_14c0._0_4_ = auVar58._0_4_ * (auVar99._0_4_ + auVar99._0_4_);
            local_14c0._4_4_ = auVar58._4_4_ * (auVar99._4_4_ + auVar99._4_4_);
            local_14c0._8_4_ = auVar58._8_4_ * (auVar99._8_4_ + auVar99._8_4_);
            local_14c0._12_4_ = auVar58._12_4_ * (auVar99._12_4_ + auVar99._12_4_);
            uVar2 = *(undefined4 *)(local_16f8 + local_1700 * 4 + 0x60);
            auVar103._4_4_ = uVar2;
            auVar103._0_4_ = uVar2;
            auVar103._8_4_ = uVar2;
            auVar103._12_4_ = uVar2;
            auVar58 = vcmpps_avx(auVar103,local_14c0,2);
            uVar2 = *(undefined4 *)(local_16f8 + local_1700 * 4 + 0x100);
            auVar104._4_4_ = uVar2;
            auVar104._0_4_ = uVar2;
            auVar104._8_4_ = uVar2;
            auVar104._12_4_ = uVar2;
            auVar99 = vcmpps_avx(local_14c0,auVar104,2);
            auVar58 = vandps_avx(auVar99,auVar58);
            auVar99 = local_16d0 & auVar58;
            if ((((auVar99 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar99 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar99 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar99[0xf] < '\0') {
              auVar58 = vandps_avx(auVar58,local_16d0);
              auVar99 = vcmpps_avx(auVar88,_DAT_01feba10,4);
              auVar68 = auVar99 & auVar58;
              if ((((auVar68 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar68 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar68 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar68[0xf] < '\0') {
                local_14f0 = vandps_avx(auVar58,auVar99);
                local_1500 = &local_1711;
                auVar58 = vrcpps_avx(local_1510);
                auVar73._8_4_ = 0x3f800000;
                auVar73._0_8_ = &DAT_3f8000003f800000;
                auVar73._12_4_ = 0x3f800000;
                auVar99 = vfnmadd213ps_fma(local_1510,auVar58,auVar73);
                auVar99 = vfmadd132ps_fma(auVar99,auVar58,auVar58);
                auVar70._8_4_ = 0x219392ef;
                auVar70._0_8_ = 0x219392ef219392ef;
                auVar70._12_4_ = 0x219392ef;
                auVar58 = vcmpps_avx(local_15a0,auVar70,5);
                auVar58 = vandps_avx(auVar99,auVar58);
                auVar63._0_4_ = local_1530 * auVar58._0_4_;
                auVar63._4_4_ = fStack_152c * auVar58._4_4_;
                auVar63._8_4_ = fStack_1528 * auVar58._8_4_;
                auVar63._12_4_ = fStack_1524 * auVar58._12_4_;
                local_14e0 = vminps_avx(auVar63,auVar73);
                auVar64._0_4_ = auVar58._0_4_ * local_1520._0_4_;
                auVar64._4_4_ = auVar58._4_4_ * local_1520._4_4_;
                auVar64._8_4_ = auVar58._8_4_ * local_1520._8_4_;
                auVar64._12_4_ = auVar58._12_4_ * local_1520._12_4_;
                local_14d0 = vminps_avx(auVar64,auVar73);
                uVar50 = vmovmskps_avx(local_14f0);
                uVar43 = (ulong)uVar50;
                local_1678 = pSVar45;
                do {
                  uVar46 = 0;
                  for (uVar47 = uVar43; (uVar47 & 1) == 0; uVar47 = uVar47 >> 1 | 0x8000000000000000
                      ) {
                    uVar46 = uVar46 + 1;
                  }
                  uVar50 = *(uint *)((long)&local_1540 + uVar46 * 4);
                  pGVar4 = (pSVar45->geometries).items[uVar50].ptr;
                  if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                    uVar43 = uVar43 ^ 1L << (uVar46 & 0x3f);
                    bVar57 = true;
                  }
                  else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                          (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar57 = false;
                  }
                  else {
                    fVar96 = *(float *)(ray + k * 4 + 0x100);
                    uVar47 = (ulong)(uint)((int)uVar46 * 4);
                    local_12c0 = *(undefined4 *)(local_14e0 + uVar47);
                    uVar2 = *(undefined4 *)(local_14d0 + uVar47);
                    local_12a0._4_4_ = uVar2;
                    local_12a0._0_4_ = uVar2;
                    local_12a0._8_4_ = uVar2;
                    local_12a0._12_4_ = uVar2;
                    local_12a0._16_4_ = uVar2;
                    local_12a0._20_4_ = uVar2;
                    local_12a0._24_4_ = uVar2;
                    local_12a0._28_4_ = uVar2;
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_14c0 + uVar47);
                    local_1610.context = context->user;
                    uVar2 = *(undefined4 *)((long)&local_1550 + uVar47);
                    local_1280._4_4_ = uVar2;
                    local_1280._0_4_ = uVar2;
                    local_1280._8_4_ = uVar2;
                    local_1280._12_4_ = uVar2;
                    local_1280._16_4_ = uVar2;
                    local_1280._20_4_ = uVar2;
                    local_1280._24_4_ = uVar2;
                    local_1280._28_4_ = uVar2;
                    uVar2 = *(undefined4 *)(local_14b0 + uVar47);
                    uVar3 = *(undefined4 *)(local_14a0 + uVar47);
                    local_1300._4_4_ = uVar3;
                    local_1300._0_4_ = uVar3;
                    local_1300._8_4_ = uVar3;
                    local_1300._12_4_ = uVar3;
                    local_1300._16_4_ = uVar3;
                    local_1300._20_4_ = uVar3;
                    local_1300._24_4_ = uVar3;
                    local_1300._28_4_ = uVar3;
                    uVar3 = *(undefined4 *)(local_1490 + uVar47);
                    local_12e0._4_4_ = uVar3;
                    local_12e0._0_4_ = uVar3;
                    local_12e0._8_4_ = uVar3;
                    local_12e0._12_4_ = uVar3;
                    local_12e0._16_4_ = uVar3;
                    local_12e0._20_4_ = uVar3;
                    local_12e0._24_4_ = uVar3;
                    local_12e0._28_4_ = uVar3;
                    local_1260._4_4_ = uVar50;
                    local_1260._0_4_ = uVar50;
                    local_1260._8_4_ = uVar50;
                    local_1260._12_4_ = uVar50;
                    local_1260._16_4_ = uVar50;
                    local_1260._20_4_ = uVar50;
                    local_1260._24_4_ = uVar50;
                    local_1260._28_4_ = uVar50;
                    local_1320[0] = (RTCHitN)(char)uVar2;
                    local_1320[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
                    local_1320[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                    local_1320[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                    local_1320[4] = (RTCHitN)(char)uVar2;
                    local_1320[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
                    local_1320[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                    local_1320[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                    local_1320[8] = (RTCHitN)(char)uVar2;
                    local_1320[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
                    local_1320[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                    local_1320[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                    local_1320[0xc] = (RTCHitN)(char)uVar2;
                    local_1320[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
                    local_1320[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                    local_1320[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                    local_1320[0x10] = (RTCHitN)(char)uVar2;
                    local_1320[0x11] = (RTCHitN)(char)((uint)uVar2 >> 8);
                    local_1320[0x12] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                    local_1320[0x13] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                    local_1320[0x14] = (RTCHitN)(char)uVar2;
                    local_1320[0x15] = (RTCHitN)(char)((uint)uVar2 >> 8);
                    local_1320[0x16] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                    local_1320[0x17] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                    local_1320[0x18] = (RTCHitN)(char)uVar2;
                    local_1320[0x19] = (RTCHitN)(char)((uint)uVar2 >> 8);
                    local_1320[0x1a] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                    local_1320[0x1b] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                    local_1320[0x1c] = (RTCHitN)(char)uVar2;
                    local_1320[0x1d] = (RTCHitN)(char)((uint)uVar2 >> 8);
                    local_1320[0x1e] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                    local_1320[0x1f] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                    uStack_12bc = local_12c0;
                    uStack_12b8 = local_12c0;
                    uStack_12b4 = local_12c0;
                    uStack_12b0 = local_12c0;
                    uStack_12ac = local_12c0;
                    uStack_12a8 = local_12c0;
                    uStack_12a4 = local_12c0;
                    auVar65 = vpcmpeqd_avx2(local_1260,local_1260);
                    uStack_123c = (local_1610.context)->instID[0];
                    local_1240 = uStack_123c;
                    uStack_1238 = uStack_123c;
                    uStack_1234 = uStack_123c;
                    uStack_1230 = uStack_123c;
                    uStack_122c = uStack_123c;
                    uStack_1228 = uStack_123c;
                    uStack_1224 = uStack_123c;
                    uStack_121c = (local_1610.context)->instPrimID[0];
                    local_1220 = uStack_121c;
                    uStack_1218 = uStack_121c;
                    uStack_1214 = uStack_121c;
                    uStack_1210 = uStack_121c;
                    uStack_120c = uStack_121c;
                    uStack_1208 = uStack_121c;
                    uStack_1204 = uStack_121c;
                    local_15c0 = local_1480._0_8_;
                    uStack_15b8 = local_1480._8_8_;
                    uStack_15b0 = local_1480._16_8_;
                    uStack_15a8 = local_1480._24_8_;
                    local_1610.valid = (int *)&local_15c0;
                    local_1610.geometryUserPtr = pGVar4->userPtr;
                    local_1610.hit = local_1320;
                    local_1610.N = 8;
                    local_1610.ray = (RTCRayN *)ray;
                    if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      local_1710 = fVar96;
                      auVar65 = ZEXT1632(auVar65._0_16_);
                      (*pGVar4->occlusionFilterN)(&local_1610);
                      auVar65 = vpcmpeqd_avx2(auVar65,auVar65);
                      auVar109 = ZEXT3264(local_15e0);
                      k = local_1700;
                      pSVar45 = local_1678;
                      ray = local_16f8;
                      fVar96 = local_1710;
                    }
                    auVar31._8_8_ = uStack_15b8;
                    auVar31._0_8_ = local_15c0;
                    auVar31._16_8_ = uStack_15b0;
                    auVar31._24_8_ = uStack_15a8;
                    auVar16 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar31);
                    auVar18 = auVar65 & ~auVar16;
                    if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar18 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar18 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar18 >> 0x7f,0) == '\0') &&
                          (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar18 >> 0xbf,0) == '\0') &&
                        (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar18[0x1f]) {
                      auVar16 = auVar16 ^ auVar65;
                    }
                    else {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        local_1710 = fVar96;
                        auVar65 = ZEXT1632(auVar65._0_16_);
                        (*p_Var5)(&local_1610);
                        auVar65 = vpcmpeqd_avx2(auVar65,auVar65);
                        auVar109 = ZEXT3264(local_15e0);
                        k = local_1700;
                        ray = local_16f8;
                        fVar96 = local_1710;
                      }
                      auVar32._8_8_ = uStack_15b8;
                      auVar32._0_8_ = local_15c0;
                      auVar32._16_8_ = uStack_15b0;
                      auVar32._24_8_ = uStack_15a8;
                      auVar18 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar32);
                      auVar16 = auVar18 ^ auVar65;
                      auVar74._8_4_ = 0xff800000;
                      auVar74._0_8_ = 0xff800000ff800000;
                      auVar74._12_4_ = 0xff800000;
                      auVar74._16_4_ = 0xff800000;
                      auVar74._20_4_ = 0xff800000;
                      auVar74._24_4_ = 0xff800000;
                      auVar74._28_4_ = 0xff800000;
                      auVar65 = vblendvps_avx(auVar74,*(undefined1 (*) [32])(local_1610.ray + 0x100)
                                              ,auVar18);
                      *(undefined1 (*) [32])(local_1610.ray + 0x100) = auVar65;
                    }
                    bVar29 = (auVar16 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                    bVar30 = (auVar16 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                    bVar28 = (auVar16 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                    bVar27 = SUB321(auVar16 >> 0x7f,0) == '\0';
                    bVar26 = (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                    bVar25 = SUB321(auVar16 >> 0xbf,0) == '\0';
                    bVar24 = (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                    bVar23 = -1 < auVar16[0x1f];
                    bVar57 = ((((((bVar29 && bVar30) && bVar28) && bVar27) && bVar26) && bVar25) &&
                             bVar24) && bVar23;
                    if (((((((bVar29 && bVar30) && bVar28) && bVar27) && bVar26) && bVar25) &&
                        bVar24) && bVar23) {
                      *(float *)(ray + k * 4 + 0x100) = fVar96;
                      uVar43 = uVar43 ^ 1L << (uVar46 & 0x3f);
                    }
                  }
                  if (!bVar57) {
                    uVar50 = 0;
                    uVar43 = local_1688;
                    uVar46 = local_1690;
                    uVar47 = local_1698;
                    uVar49 = local_16a8;
                    uVar51 = local_16b0;
                    uVar54 = local_16a0;
                    if (bVar56) {
                      *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                      uVar50 = 1;
                    }
                    goto LAB_006bf0ab;
                  }
                } while (uVar43 != 0);
              }
            }
          }
          local_1620 = local_1620 + 1;
          bVar56 = local_1620 < local_1628;
        } while (local_1620 != local_1628);
        uVar50 = 0;
        uVar43 = local_1688;
        uVar46 = local_1690;
        uVar47 = local_1698;
        uVar49 = local_16a8;
        uVar51 = local_16b0;
        uVar54 = local_16a0;
      }
    }
LAB_006bf0ab:
    puVar37 = local_1680;
  } while ((uVar50 & 3) == 0);
  return local_1618 != &local_1200;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }